

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O2

void tcu::FloatFormat_selfTest(void)

{
  bool bVar1;
  FloatFormat *pFVar2;
  TestError *this;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  TestBinary32 test32;
  string local_40;
  double local_20;
  
  pFVar2 = (FloatFormat *)operator_new(0x28);
  FloatFormat::FloatFormat(pFVar2,-0x7e,0x7f,0x17,true,MAYBE,MAYBE,MAYBE);
  local_40._M_dataplus._M_p = (pointer)0x0;
  test32.super_Test.m_fmt.super_UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>.
  m_data.ptr = pFVar2;
  de::details::UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>::~UniqueBase
            ((UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_> *)&local_40);
  dVar3 = ldexp(1.0,0);
  dVar4 = ldexp(1.0,-0x18);
  anon_unknown_4::Test::testULP(&test32.super_Test,dVar3,dVar4);
  dVar3 = ldexp(1.0,0);
  dVar4 = ldexp(1.0,-0x17);
  dVar5 = ldexp(1.0,-0x17);
  anon_unknown_4::Test::testULP(&test32.super_Test,dVar4 + dVar3,dVar5);
  dVar3 = ldexp(1.0,-0x7c);
  dVar4 = ldexp(1.0,-0x94);
  anon_unknown_4::Test::testULP(&test32.super_Test,dVar3,dVar4);
  dVar3 = ldexp(1.0,-0x7d);
  dVar4 = ldexp(1.0,-0x95);
  anon_unknown_4::Test::testULP(&test32.super_Test,dVar3,dVar4);
  dVar3 = ldexp(1.0,-0x7d);
  dVar4 = ldexp(1.0,-0x8c);
  dVar5 = ldexp(1.0,-0x94);
  anon_unknown_4::Test::testULP(&test32.super_Test,dVar4 + dVar3,dVar5);
  dVar3 = ldexp(1.0,-0x7e);
  dVar4 = ldexp(1.0,-0x95);
  anon_unknown_4::Test::testULP(&test32.super_Test,dVar3,dVar4);
  dVar3 = ldexp(1.0,-0x82);
  dVar4 = ldexp(1.0,-0x95);
  anon_unknown_4::Test::testULP(&test32.super_Test,dVar3,dVar4);
  dVar3 = ldexp(1.0,0);
  dVar4 = ldexp(1.0,-0x14);
  local_20 = ldexp(1.0,-0x28);
  local_20 = local_20 + dVar4 + dVar3;
  dVar3 = ldexp(1.0,0);
  dVar4 = ldexp(1.0,-0x14);
  dVar5 = ldexp(1.0,0);
  dVar6 = ldexp(1.0,-0x14);
  dVar7 = ldexp(1.0,-0x17);
  anon_unknown_4::Test::testRound(&test32.super_Test,local_20,dVar3 + dVar4,dVar5 + dVar6 + dVar7);
  dVar3 = ldexp(1.0,-0x7e);
  dVar4 = ldexp(1.0,-0x96);
  dVar5 = ldexp(1.0,-0x7e);
  dVar6 = ldexp(1.0,-0x95);
  dVar7 = ldexp(1.0,-0x7e);
  anon_unknown_4::Test::testRound(&test32.super_Test,dVar3 - dVar4,dVar5 - dVar6,dVar7);
  pFVar2 = test32.super_Test.m_fmt.
           super_UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>.m_data.ptr;
  dVar3 = ldexp(1.0,0);
  FloatFormat::floatToHex_abi_cxx11_(&local_40,pFVar2,dVar3);
  bVar1 = std::operator==(&local_40,"0x1.000000p0");
  std::__cxx11::string::~string((string *)&local_40);
  pFVar2 = test32.super_Test.m_fmt.
           super_UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>.m_data.ptr;
  if (bVar1) {
    dVar3 = ldexp(1.0,8);
    dVar4 = ldexp(1.0,-4);
    FloatFormat::floatToHex_abi_cxx11_(&local_40,pFVar2,dVar4 + dVar3);
    bVar1 = std::operator==(&local_40,"0x1.001000p8");
    std::__cxx11::string::~string((string *)&local_40);
    pFVar2 = test32.super_Test.m_fmt.
             super_UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>.m_data.ptr;
    if (bVar1) {
      dVar3 = ldexp(1.0,-0x8c);
      FloatFormat::floatToHex_abi_cxx11_(&local_40,pFVar2,dVar3);
      bVar1 = std::operator==(&local_40,"0x0.000400p-126");
      std::__cxx11::string::~string((string *)&local_40);
      pFVar2 = test32.super_Test.m_fmt.
               super_UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>.m_data.ptr;
      if (bVar1) {
        dVar3 = ldexp(1.0,-0x8c);
        FloatFormat::floatToHex_abi_cxx11_(&local_40,pFVar2,dVar3);
        bVar1 = std::operator==(&local_40,"0x0.000400p-126");
        std::__cxx11::string::~string((string *)&local_40);
        pFVar2 = test32.super_Test.m_fmt.
                 super_UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>.m_data.
                 ptr;
        if (bVar1) {
          dVar3 = ldexp(1.0,-0x7e);
          dVar4 = ldexp(1.0,-0x7d);
          FloatFormat::floatToHex_abi_cxx11_(&local_40,pFVar2,dVar4 + dVar3);
          bVar1 = std::operator==(&local_40,"0x1.800000p-125");
          std::__cxx11::string::~string((string *)&local_40);
          if (bVar1) {
            de::details::UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>::
            ~UniqueBase((UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_> *)
                        &test32);
            return;
          }
          this = (TestError *)__cxa_allocate_exception(0x38);
          TestError::TestError
                    (this,(char *)0x0,"m_fmt->floatToHex(p(-126) + p(-125)) == \"0x1.800000p-125\"",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuFloatFormat.cpp"
                     ,0x17b);
        }
        else {
          this = (TestError *)__cxa_allocate_exception(0x38);
          TestError::TestError
                    (this,(char *)0x0,"m_fmt->floatToHex(p(-140)) == \"0x0.000400p-126\"",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuFloatFormat.cpp"
                     ,0x17a);
        }
      }
      else {
        this = (TestError *)__cxa_allocate_exception(0x38);
        TestError::TestError
                  (this,(char *)0x0,"m_fmt->floatToHex(p(-140)) == \"0x0.000400p-126\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuFloatFormat.cpp"
                   ,0x179);
      }
    }
    else {
      this = (TestError *)__cxa_allocate_exception(0x38);
      TestError::TestError
                (this,(char *)0x0,"m_fmt->floatToHex(p(8) + p(-4)) == \"0x1.001000p8\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuFloatFormat.cpp"
                 ,0x178);
    }
  }
  else {
    this = (TestError *)__cxa_allocate_exception(0x38);
    TestError::TestError
              (this,(char *)0x0,"m_fmt->floatToHex(p(0)) == \"0x1.000000p0\"",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuFloatFormat.cpp"
               ,0x177);
  }
  __cxa_throw(this,&TestError::typeinfo,Exception::~Exception);
}

Assistant:

TestBinary32 (void)
				: Test (MovePtr<FloatFormat>(new FloatFormat(-126, 127, 23, true))) {}